

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.cpp
# Opt level: O0

int mbedtls_oid_get_numeric_string(char *buf,size_t size,mbedtls_asn1_buf *oid)

{
  long in_RDX;
  ulong in_RSI;
  char *in_RDI;
  uint component2;
  int component1;
  size_t i;
  uint value;
  size_t n;
  char *p;
  int ret;
  uint local_50;
  uint local_4c;
  ulong local_48;
  uint local_3c;
  ulong local_38;
  char *local_30;
  int local_24;
  int local_4;
  
  local_3c = 0;
  if (in_RSI < 0x80000000) {
    if (*(long *)(in_RDX + 8) == 0) {
      local_4 = -0x60;
    }
    else {
      local_38 = in_RSI;
      local_30 = in_RDI;
      for (local_48 = 0; local_48 < *(ulong *)(in_RDX + 8); local_48 = local_48 + 1) {
        if (0x1ffffff < local_3c) {
          return -0x68;
        }
        if ((local_3c == 0) && (*(char *)(*(long *)(in_RDX + 0x10) + local_48) == -0x80)) {
          return -0x68;
        }
        local_50 = *(byte *)(*(long *)(in_RDX + 0x10) + local_48) & 0x7f | local_3c << 7;
        local_3c = local_50;
        if ((*(byte *)(*(long *)(in_RDX + 0x10) + local_48) & 0x80) == 0) {
          if (local_38 == in_RSI) {
            if (local_50 < 0x50) {
              if (local_50 < 0x28) {
                local_4c = 0x30;
              }
              else {
                local_4c = 0x31;
                local_50 = local_50 - 0x28;
              }
            }
            else {
              local_4c = 0x32;
              local_50 = local_50 - 0x50;
            }
            local_24 = snprintf(local_30,local_38,"%c.%u",(ulong)local_4c,(ulong)local_50);
          }
          else {
            local_24 = snprintf(local_30,local_38,".%u",(ulong)local_50);
          }
          if ((local_24 < 2) || (local_38 <= (ulong)(long)local_24)) {
            return -0xb;
          }
          local_38 = local_38 - (long)local_24;
          local_30 = local_30 + local_24;
          local_3c = 0;
        }
      }
      if (local_3c == 0) {
        local_4 = (int)in_RSI - (int)local_38;
      }
      else {
        local_4 = -0x60;
      }
    }
  }
  else {
    local_4 = -100;
  }
  return local_4;
}

Assistant:

int mbedtls_oid_get_numeric_string(char *buf, size_t size,
                                   const mbedtls_asn1_buf *oid)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    char *p = buf;
    size_t n = size;
    unsigned int value = 0;

    if (size > INT_MAX) {
        /* Avoid overflow computing return value */
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    if (oid->len <= 0) {
        /* OID must not be empty */
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    for (size_t i = 0; i < oid->len; i++) {
        /* Prevent overflow in value. */
        if (value > (UINT_MAX >> 7)) {
            return MBEDTLS_ERR_ASN1_INVALID_DATA;
        }
        if ((value == 0) && ((oid->p[i]) == 0x80)) {
            /* Overlong encoding is not allowed */
            return MBEDTLS_ERR_ASN1_INVALID_DATA;
        }

        value <<= 7;
        value |= oid->p[i] & 0x7F;

        if (!(oid->p[i] & 0x80)) {
            /* Last byte */
            if (n == size) {
                int component1;
                unsigned int component2;
                /* First subidentifier contains first two OID components */
                if (value >= 80) {
                    component1 = '2';
                    component2 = value - 80;
                } else if (value >= 40) {
                    component1 = '1';
                    component2 = value - 40;
                } else {
                    component1 = '0';
                    component2 = value;
                }
                ret = mbedtls_snprintf(p, n, "%c.%u", component1, component2);
            } else {
                ret = mbedtls_snprintf(p, n, ".%u", value);
            }
            if (ret < 2 || (size_t) ret >= n) {
                return MBEDTLS_ERR_OID_BUF_TOO_SMALL;
            }
            n -= (size_t) ret;
            p += ret;
            value = 0;
        }
    }

    if (value != 0) {
        /* Unterminated subidentifier */
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    return (int) (size - n);
}